

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CY.hpp
# Opt level: O1

void __thiscall qclab::qgates::CY<std::complex<double>_>::CY(CY<std::complex<double>_> *this)

{
  PauliY<std::complex<double>_> *pPVar1;
  
  (this->super_QControlledGate2<std::complex<double>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<double>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00524df0;
  pPVar1 = (PauliY<std::complex<double>_> *)operator_new(0x10);
  (pPVar1->super_QGate1<std::complex<double>_>).qubit_ = 1;
  (pPVar1->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
       (QObject<std::complex<double>_>)&PTR_nbQubits_0051ff90;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliY<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliY<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliY<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliY<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliY<std::complex<double>_>_*,_false>._M_head_impl =
       pPVar1;
  return;
}

Assistant:

CY()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliY< T > >( 1 ) )
        { }